

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadalloc.h
# Opt level: O0

void snmalloc::ThreadAlloc::teardown(void)

{
  undefined8 *in_FS_OFFSET;
  bool in_stack_000000ff;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_00000100;
  
  if (*(Alloc **)*in_FS_OFFSET != &default_alloc) {
    *(undefined1 *)*in_FS_OFFSET = 1;
    Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
              (in_stack_00000100,in_stack_000000ff);
    Pool<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::ConstructAllocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_&snmalloc::StandardConfigClientMeta<>::pool>
    ::release((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              0x119750);
    *(Alloc **)*in_FS_OFFSET = &default_alloc;
  }
  return;
}

Assistant:

static void teardown()
    {
      // No work required for teardown.
      if (alloc == &default_alloc)
        return;

      teardown_called = true;
      alloc->flush();
      AllocPool<Config>::release(alloc);
      alloc = const_cast<Alloc*>(&default_alloc);
    }